

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int ParseSegmentHeader(VP8BitReader *br,VP8SegmentHeader *hdr,VP8Proba *proba)

{
  uint32_t uVar1;
  int32_t iVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint32_t *in_RSI;
  long in_RDI;
  int s_1;
  int s;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  undefined1 local_28;
  undefined1 local_24;
  int local_20;
  int local_1c;
  
  uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  *in_RSI = uVar1;
  if (*in_RSI == 0) {
    in_RSI[1] = 0;
  }
  else {
    uVar1 = VP8GetValue((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    in_RSI[1] = uVar1;
    uVar1 = VP8GetValue((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    if (uVar1 != 0) {
      uVar1 = VP8GetValue((VP8BitReader *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      in_RSI[2] = uVar1;
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        uVar1 = VP8GetValue((VP8BitReader *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        if (uVar1 == 0) {
          local_24 = 0;
        }
        else {
          iVar2 = VP8GetSignedValue((VP8BitReader *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                    in_stack_ffffffffffffffcc);
          local_24 = (undefined1)iVar2;
        }
        *(undefined1 *)((long)in_RSI + (long)local_1c + 0xc) = local_24;
      }
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        uVar1 = VP8GetValue((VP8BitReader *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        if (uVar1 == 0) {
          local_28 = 0;
        }
        else {
          iVar2 = VP8GetSignedValue((VP8BitReader *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                    in_stack_ffffffffffffffcc);
          local_28 = (undefined1)iVar2;
        }
        *(undefined1 *)((long)in_RSI + (long)local_1c + 0x10) = local_28;
      }
    }
    if (in_RSI[1] != 0) {
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        uVar1 = VP8GetValue((VP8BitReader *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        if (uVar1 == 0) {
          in_stack_ffffffffffffffd4 = 0xff;
        }
        else {
          in_stack_ffffffffffffffd4 =
               VP8GetValue((VP8BitReader *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
        }
        *(char *)(CONCAT71(in_register_00000011,in_DL) + (long)local_20) =
             (char)in_stack_ffffffffffffffd4;
      }
    }
  }
  return (int)((*(int *)(in_RDI + 0x28) != 0 ^ 0xffU) & 1);
}

Assistant:

static int ParseSegmentHeader(VP8BitReader* br,
                              VP8SegmentHeader* hdr, VP8Proba* proba) {
  assert(br != NULL);
  assert(hdr != NULL);
  hdr->use_segment_ = VP8Get(br, "global-header");
  if (hdr->use_segment_) {
    hdr->update_map_ = VP8Get(br, "global-header");
    if (VP8Get(br, "global-header")) {   // update data
      int s;
      hdr->absolute_delta_ = VP8Get(br, "global-header");
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        hdr->quantizer_[s] = VP8Get(br, "global-header") ?
            VP8GetSignedValue(br, 7, "global-header") : 0;
      }
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        hdr->filter_strength_[s] = VP8Get(br, "global-header") ?
            VP8GetSignedValue(br, 6, "global-header") : 0;
      }
    }
    if (hdr->update_map_) {
      int s;
      for (s = 0; s < MB_FEATURE_TREE_PROBS; ++s) {
        proba->segments_[s] = VP8Get(br, "global-header") ?
            VP8GetValue(br, 8, "global-header") : 255u;
      }
    }
  } else {
    hdr->update_map_ = 0;
  }
  return !br->eof_;
}